

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbjava.cpp
# Opt level: O0

string * trim(string *__return_storage_ptr__,string *s)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  reference pcVar4;
  bool bVar5;
  allocator<char> local_49;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  const_reverse_iterator rit;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  const_iterator it;
  string *s_local;
  
  it._M_current = (char *)s;
  local_20._M_current = (char *)std::__cxx11::string::cbegin((string *)s);
  while( true ) {
    rit.current._M_current =
         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )std::__cxx11::string::end((string *)it._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_20,&rit.current);
    bVar5 = false;
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      iVar2 = isspace((int)*pcVar3);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  std::__cxx11::string::crbegin();
  while( true ) {
    local_38._M_current =
         (char *)std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::base(&local_30);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_20);
    bVar5 = false;
    if (bVar1) {
      pcVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&local_30);
      iVar2 = isspace((int)*pcVar4);
      bVar5 = iVar2 != 0;
    }
    if (!bVar5) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_30);
  }
  local_40._M_current = local_20._M_current;
  local_48._M_current =
       (char *)std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::base(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_40,local_48,&local_49);
  std::allocator<char>::~allocator(&local_49);
  return __return_storage_ptr__;
}

Assistant:

string trim(const string& s)
{
	auto it = s.cbegin();
	while (it != s.end() && isspace(*it))
		++it;

	auto rit = s.crbegin();
	while (rit.base() != it && isspace(*rit))
		++rit;

	return string(it, rit.base());
}